

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::buildLocalVariableList(PrinterStream *this,Function *f)

{
  pointer *ppbVar1;
  bool bVar2;
  byte bVar3;
  size_type __n;
  pool_ref<soul::heart::Variable> *ppVar4;
  Variable *pVVar5;
  string *psVar6;
  mapped_type *this_00;
  bool local_141;
  string local_110;
  anon_class_16_2_a56975aa *local_f0;
  PrinterStream *local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  string name;
  pool_ref<soul::heart::Variable> *v_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range2_1;
  pool_ref<soul::heart::Variable> *v;
  pool_ref<soul::heart::Variable> *__end2;
  pool_ref<soul::heart::Variable> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *__range2;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedNames;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  localVars;
  int unnamedVariableIndex;
  Function *f_local;
  PrinterStream *this_local;
  
  localVars.
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  unordered_map<soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->localVariableNames);
  ppbVar1 = &usedNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Function::getAllLocalVariables
            ((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
              *)ppbVar1,f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  __n = std::
        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ::size((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                *)ppbVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50,__n);
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::begin(&f->parameters)
  ;
  ppVar4 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::end(&f->parameters);
  for (; __end2 != ppVar4; __end2 = __end2 + 1) {
    pVVar5 = pool_ref<soul::heart::Variable>::operator->(__end2);
    psVar6 = Identifier::toString_abi_cxx11_(&pVVar5->name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50,psVar6);
  }
  ppbVar1 = &usedNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = std::
             vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ::begin((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                      *)ppbVar1);
  v_1 = (pool_ref<soul::heart::Variable> *)
        std::
        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ::end((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               *)ppbVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                        *)&v_1);
    if (!bVar2) break;
    name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
         ::operator*(&__end2_1);
    pVVar5 = pool_ref<soul::heart::Variable>::operator->
                       ((pool_ref<soul::heart::Variable> *)name.field_2._8_8_);
    bVar2 = Variable::isMutableLocal(pVVar5);
    local_141 = true;
    if (!bVar2) {
      pVVar5 = pool_ref<soul::heart::Variable>::operator->
                         ((pool_ref<soul::heart::Variable> *)name.field_2._8_8_);
      local_141 = Variable::isConstant(pVVar5);
    }
    checkAssertion(local_141,"v->isMutableLocal() || v->isConstant()","buildLocalVariableList",0x156
                  );
    std::__cxx11::string::string((string *)local_c0);
    pVVar5 = pool_ref<soul::heart::Variable>::operator->
                       ((pool_ref<soul::heart::Variable> *)name.field_2._8_8_);
    bVar2 = Identifier::isValid(&pVVar5->name);
    if (bVar2) {
      pVVar5 = pool_ref<soul::heart::Variable>::operator->
                         ((pool_ref<soul::heart::Variable> *)name.field_2._8_8_);
      psVar6 = Identifier::toString_abi_cxx11_(&pVVar5->name);
      std::__cxx11::string::operator=((string *)local_c0,(string *)psVar6);
      bVar3 = std::__cxx11::string::empty();
      checkAssertion((bool)(bVar3 ^ 1),"! name.empty()","buildLocalVariableList",0x15c);
      local_f0 = (anon_class_16_2_a56975aa *)local_50;
      local_e8 = this;
      addSuffixToMakeUnique<soul::heart::Printer::PrinterStream::buildLocalVariableList(soul::heart::Function_const&)::_lambda(std::__cxx11::string_const&)_1_>
                (&local_e0,(soul *)local_c0,(string *)&local_f0,local_f0);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,(value_type *)local_c0);
    }
    else {
      std::__cxx11::to_string
                (&local_110,
                 localVars.
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      localVars.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           localVars.
           super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    this_00 = std::
              unordered_map<soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->localVariableNames,(key_type *)name.field_2._8_8_);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ::~vector((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             *)&usedNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void buildLocalVariableList (const heart::Function& f)
        {
            int unnamedVariableIndex = 0;
            localVariableNames.clear();
            auto localVars = f.getAllLocalVariables();
            std::vector<std::string> usedNames;
            usedNames.reserve (localVars.size());

            for (auto& v : f.parameters)
                usedNames.push_back (v->name.toString());

            for (auto& v : localVars)
            {
                SOUL_ASSERT (v->isMutableLocal() || v->isConstant());
                std::string name;

                if (v->name.isValid())
                {
                    name = v->name.toString();
                    SOUL_ASSERT (! name.empty());
                    name = addSuffixToMakeUnique (name, [&] (const std::string& nm) { return contains (usedNames, nm)
                                                                                              || contains (allVisibleVariables, nm); });
                    usedNames.push_back (name);
                }
                else
                {
                    name = std::to_string (unnamedVariableIndex++);
                }

                localVariableNames[v] = name;
            }
        }